

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

void __thiscall cereal::JSONInputArchive::JSONInputArchive(JSONInputArchive *this,istream *stream)

{
  Document *this_00;
  undefined1 local_30 [16];
  
  (this->super_InputArchive<cereal::JSONInputArchive,_0U>).super_InputArchiveBase.
  _vptr_InputArchiveBase = (_func_int **)&PTR__JSONInputArchive_001e18e8;
  InputArchive<cereal::JSONInputArchive,_0U>::InputArchive
            (&this->super_InputArchive<cereal::JSONInputArchive,_0U>,this);
  (this->super_InputArchive<cereal::JSONInputArchive,_0U>).super_InputArchiveBase.
  _vptr_InputArchiveBase = (_func_int **)&PTR__JSONInputArchive_001e18e8;
  this->itsNextName = (char *)0x0;
  rapidjson::BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::
  BasicIStreamWrapper(&this->itsReadStream,stream);
  (this->itsIteratorStack).
  super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->itsIteratorStack).
  super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->itsIteratorStack).
  super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = &this->itsDocument;
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(this_00,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::ParseStream<272u,rapidjson::UTF8<char>,rapidjson::BasicIStreamWrapper<std::istream>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)this_00,&this->itsReadStream);
  if ((this->itsDocument).
      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      .data_.f.flags == 4) {
    local_30._0_8_ =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::Begin(&this_00->
                  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                );
    local_30._8_8_ =
         rapidjson::
         GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         ::End(&this_00->
                super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              );
    std::
    vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>::
    emplace_back<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>*,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>*>
              ((vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>
                *)&this->itsIteratorStack,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                **)local_30,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                **)(local_30 + 8));
  }
  else {
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    MemberBegin((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_30);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)(local_30 + 8));
    std::
    vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>::
    emplace_back<rapidjson::GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::GenericMemberIterator<false,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              ((vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>
                *)&this->itsIteratorStack,
               (GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_30,
               (GenericMemberIterator<false,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)(local_30 + 8));
  }
  return;
}

Assistant:

JSONInputArchive(std::istream & stream) :
        InputArchive<JSONInputArchive>(this),
        itsNextName( nullptr ),
        itsReadStream(stream)
      {
        itsDocument.ParseStream<>(itsReadStream);
        if (itsDocument.IsArray())
          itsIteratorStack.emplace_back(itsDocument.Begin(), itsDocument.End());
        else
          itsIteratorStack.emplace_back(itsDocument.MemberBegin(), itsDocument.MemberEnd());
      }